

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

void __thiscall
spvtools::val::ValidationState_t::RegisterCapability(ValidationState_t *this,Capability cap)

{
  bool bVar1;
  spv_result_t sVar2;
  Capability cap_00;
  undefined1 local_98 [4];
  Capability capability;
  iterator __end3;
  iterator __begin3;
  CapabilitySet *__range3;
  spv_operand_desc desc;
  Capability local_14;
  ValidationState_t *pVStack_10;
  Capability cap_local;
  ValidationState_t *this_local;
  
  local_14 = cap;
  pVStack_10 = this;
  bVar1 = EnumSet<spv::Capability>::contains(&this->module_capabilities_,cap);
  if (!bVar1) {
    EnumSet<spv::Capability>::insert
              ((pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> *)&desc,
               &this->module_capabilities_,&local_14);
    sVar2 = AssemblyGrammar::lookupOperand
                      (&this->grammar_,SPV_OPERAND_TYPE_CAPABILITY,local_14,
                       (spv_operand_desc *)&__range3);
    if (sVar2 == SPV_SUCCESS) {
      EnumSet<spv::Capability>::EnumSet
                ((EnumSet<spv::Capability> *)&__begin3.bucketOffset_,
                 *(ElementType *)
                  ((long)&(__range3->buckets_).
                          super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4),
                 (Capability *)
                 (__range3->buckets_).
                 super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      EnumSet<spv::Capability>::begin
                ((iterator *)&__end3.bucketOffset_,
                 (EnumSet<spv::Capability> *)&__begin3.bucketOffset_);
      EnumSet<spv::Capability>::end
                ((iterator *)local_98,(EnumSet<spv::Capability> *)&__begin3.bucketOffset_);
      while (bVar1 = EnumSet<spv::Capability>::Iterator::operator!=
                               ((Iterator *)&__end3.bucketOffset_,(Iterator *)local_98), bVar1) {
        cap_00 = EnumSet<spv::Capability>::Iterator::operator*((Iterator *)&__end3.bucketOffset_);
        RegisterCapability(this,cap_00);
        EnumSet<spv::Capability>::Iterator::operator++((Iterator *)&__end3.bucketOffset_);
      }
      EnumSet<spv::Capability>::~EnumSet((EnumSet<spv::Capability> *)&__begin3.bucketOffset_);
    }
    if (local_14 == CapabilityKernel) {
      (this->features_).group_ops_reduce_and_scans = true;
    }
    else if (local_14 - CapabilityFloat16Buffer < 2) {
      (this->features_).declare_float16_type = true;
    }
    else if (local_14 == CapabilityInt16) {
      (this->features_).declare_int16_type = true;
    }
    else if (local_14 == CapabilityInt8) {
      (this->features_).use_int8_type = true;
      (this->features_).declare_int8_type = true;
    }
    else {
      if (local_14 != CapabilityWorkgroupMemoryExplicitLayout8BitAccessKHR) {
        if ((local_14 == CapabilityWorkgroupMemoryExplicitLayout16BitAccessKHR) ||
           (local_14 - CapabilityStorageBuffer16BitAccess < 4)) {
          (this->features_).declare_int16_type = true;
          (this->features_).declare_float16_type = true;
          (this->features_).free_fp_rounding_mode = true;
          return;
        }
        if (local_14 - CapabilityVariablePointersStorageBuffer < 2) {
          (this->features_).variable_pointers = true;
          return;
        }
        if (2 < local_14 - CapabilityStorageBuffer8BitAccess) {
          return;
        }
      }
      (this->features_).declare_int8_type = true;
    }
  }
  return;
}

Assistant:

void ValidationState_t::RegisterCapability(spv::Capability cap) {
  // Avoid redundant work.  Otherwise the recursion could induce work
  // quadrdatic in the capability dependency depth. (Ok, not much, but
  // it's something.)
  if (module_capabilities_.contains(cap)) return;

  module_capabilities_.insert(cap);
  spv_operand_desc desc;
  if (SPV_SUCCESS == grammar_.lookupOperand(SPV_OPERAND_TYPE_CAPABILITY,
                                            uint32_t(cap), &desc)) {
    for (auto capability :
         CapabilitySet(desc->numCapabilities, desc->capabilities)) {
      RegisterCapability(capability);
    }
  }

  switch (cap) {
    case spv::Capability::Kernel:
      features_.group_ops_reduce_and_scans = true;
      break;
    case spv::Capability::Int8:
      features_.use_int8_type = true;
      features_.declare_int8_type = true;
      break;
    case spv::Capability::StorageBuffer8BitAccess:
    case spv::Capability::UniformAndStorageBuffer8BitAccess:
    case spv::Capability::StoragePushConstant8:
    case spv::Capability::WorkgroupMemoryExplicitLayout8BitAccessKHR:
      features_.declare_int8_type = true;
      break;
    case spv::Capability::Int16:
      features_.declare_int16_type = true;
      break;
    case spv::Capability::Float16:
    case spv::Capability::Float16Buffer:
      features_.declare_float16_type = true;
      break;
    case spv::Capability::StorageUniformBufferBlock16:
    case spv::Capability::StorageUniform16:
    case spv::Capability::StoragePushConstant16:
    case spv::Capability::StorageInputOutput16:
    case spv::Capability::WorkgroupMemoryExplicitLayout16BitAccessKHR:
      features_.declare_int16_type = true;
      features_.declare_float16_type = true;
      features_.free_fp_rounding_mode = true;
      break;
    case spv::Capability::VariablePointers:
    case spv::Capability::VariablePointersStorageBuffer:
      features_.variable_pointers = true;
      break;
    default:
      // TODO(dneto): For now don't validate SPV_NV_ray_tracing, which uses
      // capability spv::Capability::RayTracingNV.
      // spv::Capability::RayTracingProvisionalKHR would need the same
      // treatment. One of the differences going from SPV_KHR_ray_tracing from
      // provisional to final spec was the provisional spec uses Locations
      // for variables in certain storage classes, just like the
      // SPV_NV_ray_tracing extension.  So it mimics the NVIDIA extension.
      // The final SPV_KHR_ray_tracing uses a different capability token
      // number, so it doesn't fall into this case.
      break;
  }
}